

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O2

symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_symmetric_difference_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>>>>>,std::greater<void>>
          (symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this)

{
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
  local_50;
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
  local_38;
  
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
  ::owning_iterator(&local_38,
                    (owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
                     *)this);
  owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
  ::owning_iterator(&local_50,
                    (owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>
                     *)(this + 0x18));
  make_symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)&local_38,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.m_container.
              super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m_container.
              super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto make_symmetric_difference_iterator (RandomAccessRange && ranges, Compare compare)
    {
        using std::begin;
        using std::end;
        return
            make_symmetric_difference_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges)),
                compare
            );
    }